

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyboardConfigTab.cpp
# Opt level: O1

void __thiscall
KeyboardConfigTab::KeyboardConfigTab
          (KeyboardConfigTab *this,PianoInput *input,ShortcutTable *shortcuts,QWidget *parent)

{
  uint uVar1;
  QVBoxLayout *this_00;
  QLabel *pQVar2;
  QComboBox *pQVar3;
  QGroupBox *pQVar4;
  QVBoxLayout *pQVar5;
  BindingEdit *pBVar6;
  QTreeView *this_01;
  ShortcutTableModel *pSVar7;
  QHBoxLayout *this_02;
  QKeySequenceEdit *pQVar8;
  QPushButton *pQVar9;
  Bindings *__src;
  undefined4 *puVar10;
  void **ppvVar11;
  KeyboardLayout layout;
  anon_union_24_3_e3d07ef4_for_data local_c8;
  undefined8 local_b0;
  QHBoxLayout *local_a8;
  QGroupBox *local_a0;
  anon_union_24_3_e3d07ef4_for_data local_98;
  PianoInput *local_80;
  QTreeView *local_78;
  QObject local_70 [8];
  QObject local_68 [8];
  QObject local_60 [8];
  QObject local_58 [8];
  QObject local_50 [8];
  QObject local_48 [8];
  QObject local_40 [8];
  QIcon local_38 [8];
  
  ConfigTab::ConfigTab(&this->super_ConfigTab,parent);
  *(undefined ***)&this->super_ConfigTab = &PTR_metaObject_001fba28;
  *(undefined ***)&(this->super_ConfigTab).field_0x10 = &PTR__KeyboardConfigTab_001fbbd8;
  this->mInput = input;
  this->mShortcuts = shortcuts;
  this->mSelectedShortcut = -1;
  local_80 = input;
  this_00 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(this_00);
  local_a8 = (QHBoxLayout *)operator_new(0x20);
  QHBoxLayout::QHBoxLayout(local_a8);
  pQVar2 = (QLabel *)operator_new(0x28);
  QMetaObject::tr((char *)local_c8.data,(char *)&staticMetaObject,0x1b4b78);
  QLabel::QLabel(pQVar2,&local_c8,0,0);
  QBoxLayout::addWidget(local_a8,pQVar2,0,0);
  if ((QArrayData *)local_c8.shared != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_c8.shared = *(int *)local_c8.shared + -1;
    UNLOCK();
    if (*(int *)local_c8.shared == 0) {
      QArrayData::deallocate((QArrayData *)local_c8.shared,2,8);
    }
  }
  pQVar3 = (QComboBox *)operator_new(0x28);
  QComboBox::QComboBox(pQVar3,(QWidget *)0x0);
  this->mLayoutCombo = pQVar3;
  QBoxLayout::addWidget(local_a8,pQVar3,1,0);
  pQVar4 = (QGroupBox *)operator_new(0x28);
  QMetaObject::tr((char *)local_c8.data,(char *)&staticMetaObject,0x1b4b80);
  QGroupBox::QGroupBox(pQVar4,(QString *)&local_c8,(QWidget *)0x0);
  this->mCustomGroup = pQVar4;
  if ((QArrayData *)local_c8.shared != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_c8.shared = *(int *)local_c8.shared + -1;
    UNLOCK();
    if (*(int *)local_c8.shared == 0) {
      QArrayData::deallocate((QArrayData *)local_c8.shared,2,8);
    }
  }
  pQVar5 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(pQVar5);
  pQVar2 = (QLabel *)operator_new(0x28);
  QMetaObject::tr((char *)local_c8.data,(char *)&staticMetaObject,0x1b4b8e);
  QLabel::QLabel(pQVar2,&local_c8,0,0);
  QBoxLayout::addWidget(pQVar5,pQVar2,0,0);
  if ((QArrayData *)local_c8.shared != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_c8.shared = *(int *)local_c8.shared + -1;
    UNLOCK();
    if (*(int *)local_c8.shared == 0) {
      QArrayData::deallocate((QArrayData *)local_c8.shared,2,8);
    }
  }
  pBVar6 = (BindingEdit *)operator_new(0x100);
  BindingEdit::BindingEdit(pBVar6,(QWidget *)0x0);
  this->mBindingEdit = pBVar6;
  QBoxLayout::addWidget(pQVar5,pBVar6,0,0);
  QWidget::setLayout((QLayout *)this->mCustomGroup);
  local_a0 = (QGroupBox *)operator_new(0x28);
  QMetaObject::tr((char *)local_c8.data,(char *)&staticMetaObject,0x1b4bc3);
  QGroupBox::QGroupBox(local_a0,(QString *)&local_c8,(QWidget *)0x0);
  if ((QArrayData *)local_c8.shared != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_c8.shared = *(int *)local_c8.shared + -1;
    UNLOCK();
    if (*(int *)local_c8.shared == 0) {
      QArrayData::deallocate((QArrayData *)local_c8.shared,2,8);
    }
  }
  pQVar5 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(pQVar5);
  this_01 = (QTreeView *)operator_new(0x28);
  QTreeView::QTreeView(this_01,(QWidget *)0x0);
  pSVar7 = (ShortcutTableModel *)operator_new(0x18);
  QAbstractItemModel::QAbstractItemModel((QAbstractItemModel *)pSVar7,(QObject *)this);
  *(undefined ***)pSVar7 = &PTR_metaObject_00200690;
  pSVar7->mSrc = shortcuts;
  this->mModel = pSVar7;
  (**(code **)(*(long *)this_01 + 0x1c8))(this_01);
  local_78 = this_01;
  this_02 = (QHBoxLayout *)operator_new(0x20);
  QHBoxLayout::QHBoxLayout(this_02);
  pQVar8 = (QKeySequenceEdit *)operator_new(0x28);
  QKeySequenceEdit::QKeySequenceEdit(pQVar8,(QWidget *)0x0);
  this->mKeyEdit = pQVar8;
  pQVar9 = (QPushButton *)operator_new(0x28);
  QMetaObject::tr((char *)local_c8.data,(char *)&staticMetaObject,0x1b4bcd);
  QPushButton::QPushButton(pQVar9,(QString *)&local_c8,(QWidget *)0x0);
  this->mClearButton = pQVar9;
  if ((QArrayData *)local_c8.shared != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_c8.shared = *(int *)local_c8.shared + -1;
    UNLOCK();
    if (*(int *)local_c8.shared == 0) {
      QArrayData::deallocate((QArrayData *)local_c8.shared,2,8);
    }
  }
  pQVar9 = (QPushButton *)operator_new(0x28);
  QMetaObject::tr((char *)local_c8.data,(char *)&staticMetaObject,0x1b481e);
  QPushButton::QPushButton(pQVar9,(QString *)&local_c8,(QWidget *)0x0);
  this->mDefaultButton = pQVar9;
  if ((QArrayData *)local_c8.shared != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_c8.shared = *(int *)local_c8.shared + -1;
    UNLOCK();
    if (*(int *)local_c8.shared == 0) {
      QArrayData::deallocate((QArrayData *)local_c8.shared,2,8);
    }
  }
  pQVar2 = (QLabel *)operator_new(0x28);
  QMetaObject::tr((char *)local_c8.data,(char *)&staticMetaObject,0x1b4bd3);
  QLabel::QLabel(pQVar2,&local_c8,0,0);
  QBoxLayout::addWidget(this_02,pQVar2,0,0);
  if ((QArrayData *)local_c8.shared != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_c8.shared = *(int *)local_c8.shared + -1;
    UNLOCK();
    if (*(int *)local_c8.shared == 0) {
      QArrayData::deallocate((QArrayData *)local_c8.shared,2,8);
    }
  }
  QBoxLayout::addWidget(this_02,this->mKeyEdit,1,0);
  QBoxLayout::addWidget(this_02,this->mClearButton,0,0);
  QBoxLayout::addWidget(this_02,this->mDefaultButton,0,0);
  QBoxLayout::addWidget(pQVar5,local_78,1,0);
  QBoxLayout::addLayout((QLayout *)pQVar5,(int)this_02);
  QWidget::setLayout((QLayout *)local_a0);
  QBoxLayout::addLayout((QLayout *)this_00,(int)local_a8);
  QBoxLayout::addWidget(this_00,this->mCustomGroup,0,0);
  QBoxLayout::addWidget(this_00,local_a0,0,0);
  QBoxLayout::addStretch((int)this_00);
  QWidget::setLayout((QLayout *)this);
  layout = LayoutQwerty;
  QTreeView::resizeColumnToContents((int)local_78);
  do {
    pQVar3 = this->mLayoutCombo;
    PianoInput::layoutName((QString *)&local_98,layout);
    local_c8.shared = (PrivateShared *)0x0;
    local_c8._8_8_ = 0;
    local_c8._16_8_ = 0;
    local_b0 = 2;
    uVar1 = QComboBox::count();
    QIcon::QIcon(local_38);
    QComboBox::insertItem
              ((int)pQVar3,(QIcon *)(ulong)uVar1,(QString *)local_38,(QVariant *)&local_98);
    QIcon::~QIcon(local_38);
    QVariant::~QVariant((QVariant *)&local_c8);
    if ((QArrayData *)local_98.shared != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_98.shared = *(int *)local_98.shared + -1;
      UNLOCK();
      if (*(int *)local_98.shared == 0) {
        QArrayData::deallocate((QArrayData *)local_98.shared,2,8);
      }
    }
    layout = layout + LayoutQwertz;
  } while (layout != LayoutCount);
  pQVar3 = this->mLayoutCombo;
  PianoInput::layout(local_80);
  QComboBox::setCurrentIndex((int)pQVar3);
  pQVar4 = this->mCustomGroup;
  PianoInput::layout(local_80);
  QWidget::setEnabled(SUB81(pQVar4,0));
  pBVar6 = this->mBindingEdit;
  __src = PianoInput::bindings(local_80);
  memcpy(&pBVar6->mBindings,__src,0xc4);
  QWidget::update();
  pBVar6 = this->mBindingEdit;
  local_c8.shared = (PrivateShared *)BindingEdit::bindingsChanged;
  local_c8._8_8_ = 0;
  local_98.shared = (PrivateShared *)ConfigTab::setDirty<(Config::Category)4>;
  local_98._8_8_ = 0;
  puVar10 = (undefined4 *)operator_new(0x20);
  *puVar10 = 1;
  *(code **)(puVar10 + 2) =
       QtPrivate::QSlotObject<void_(ConfigTab::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar10 + 4) = ConfigTab::setDirty<(Config::Category)4>;
  *(undefined8 *)(puVar10 + 6) = 0;
  QObject::connectImpl
            (local_40,(void **)pBVar6,(QObject *)local_c8.data,(void **)this,
             (QSlotObjectBase *)&local_98,(ConnectionType)puVar10,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_40);
  pQVar8 = this->mKeyEdit;
  pQVar9 = this->mClearButton;
  local_c8.shared = (PrivateShared *)QAbstractButton::clicked;
  local_c8._8_8_ = 0;
  local_98.shared = (PrivateShared *)QKeySequenceEdit::clear;
  local_98._8_8_ = 0;
  puVar10 = (undefined4 *)operator_new(0x20);
  *puVar10 = 1;
  *(code **)(puVar10 + 2) =
       QtPrivate::QSlotObject<void_(QKeySequenceEdit::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar10 + 4) = QKeySequenceEdit::clear;
  *(undefined8 *)(puVar10 + 6) = 0;
  QObject::connectImpl
            (local_48,(void **)pQVar9,(QObject *)local_c8.data,(void **)pQVar8,
             (QSlotObjectBase *)&local_98,(ConnectionType)puVar10,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_48);
  pQVar9 = this->mDefaultButton;
  local_c8.shared = (PrivateShared *)QAbstractButton::clicked;
  local_c8._8_8_ = 0;
  puVar10 = (undefined4 *)operator_new(0x18);
  *puVar10 = 1;
  *(code **)(puVar10 + 2) =
       QtPrivate::
       QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/src/config/tabs/KeyboardConfigTab.cpp:508:9),_0,_QtPrivate::List<>,_void>
       ::impl;
  *(KeyboardConfigTab **)(puVar10 + 4) = this;
  QObject::connectImpl
            (local_50,(void **)pQVar9,(QObject *)local_c8.data,(void **)this,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar10,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_50);
  ppvVar11 = (void **)QAbstractItemView::selectionModel();
  local_c8.shared = (PrivateShared *)QItemSelectionModel::selectionChanged;
  local_c8._8_8_ = 0;
  puVar10 = (undefined4 *)operator_new(0x18);
  *puVar10 = 1;
  *(code **)(puVar10 + 2) =
       QtPrivate::
       QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/src/config/tabs/KeyboardConfigTab.cpp:514:9),_1,_QtPrivate::List<const_QItemSelection_&>,_void>
       ::impl;
  *(KeyboardConfigTab **)(puVar10 + 4) = this;
  QObject::connectImpl
            (local_58,ppvVar11,(QObject *)local_c8.data,(void **)this,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar10,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_58);
  pQVar8 = this->mKeyEdit;
  local_c8.shared = (PrivateShared *)QKeySequenceEdit::keySequenceChanged;
  local_c8._8_8_ = 0;
  puVar10 = (undefined4 *)operator_new(0x18);
  *puVar10 = 1;
  *(code **)(puVar10 + 2) =
       QtPrivate::
       QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/src/config/tabs/KeyboardConfigTab.cpp:532:9),_1,_QtPrivate::List<const_QKeySequence_&>,_void>
       ::impl;
  *(KeyboardConfigTab **)(puVar10 + 4) = this;
  QObject::connectImpl
            (local_60,(void **)pQVar8,(QObject *)local_c8.data,(void **)this,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar10,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_60);
  pSVar7 = this->mModel;
  local_c8.shared = (PrivateShared *)QAbstractItemModel::dataChanged;
  local_c8._8_8_ = 0;
  local_98.shared = (PrivateShared *)ConfigTab::setDirty<(Config::Category)4>;
  local_98._8_8_ = 0;
  puVar10 = (undefined4 *)operator_new(0x20);
  *puVar10 = 1;
  *(code **)(puVar10 + 2) =
       QtPrivate::QSlotObject<void_(ConfigTab::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar10 + 4) = ConfigTab::setDirty<(Config::Category)4>;
  *(undefined8 *)(puVar10 + 6) = 0;
  QObject::connectImpl
            (local_68,(void **)pSVar7,(QObject *)local_c8.data,(void **)this,
             (QSlotObjectBase *)&local_98,(ConnectionType)puVar10,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_68);
  pQVar3 = this->mLayoutCombo;
  local_c8.shared = (PrivateShared *)QComboBox::currentIndexChanged;
  local_c8._8_8_ = 0;
  puVar10 = (undefined4 *)operator_new(0x18);
  *puVar10 = 1;
  *(code **)(puVar10 + 2) =
       QtPrivate::
       QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/src/config/tabs/KeyboardConfigTab.cpp:541:9),_1,_QtPrivate::List<int>,_void>
       ::impl;
  *(KeyboardConfigTab **)(puVar10 + 4) = this;
  QObject::connectImpl
            (local_70,(void **)pQVar3,(QObject *)local_c8.data,(void **)this,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar10,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_70);
  setKeyEditEnable(this,false);
  return;
}

Assistant:

KeyboardConfigTab::KeyboardConfigTab(PianoInput &input, ShortcutTable &shortcuts, QWidget *parent) :
    ConfigTab(parent),
    mInput(input),
    mShortcuts(shortcuts),
    mSelectedShortcut(-1)
{

    auto layout = new QVBoxLayout;

    auto keyboardLayoutLayout = new QHBoxLayout;
    keyboardLayoutLayout->addWidget(new QLabel(tr("Layout:")));

    mLayoutCombo = new QComboBox;
    keyboardLayoutLayout->addWidget(mLayoutCombo, 1);

    mCustomGroup = new QGroupBox(tr("Custom layout"));
    auto customLayout = new QVBoxLayout;
    customLayout->addWidget(new QLabel(tr("Assign keys to each note. Press Shift+Del to unbind.")));
    mBindingEdit = new BindingEdit;
    customLayout->addWidget(mBindingEdit);
    mCustomGroup->setLayout(customLayout);

    auto shortcutGroup = new QGroupBox(tr("Shortcuts"));
    auto shortcutLayout = new QVBoxLayout;
    auto shortcutView = new QTreeView;
    mModel = new ShortcutTableModel(shortcuts, this);
    shortcutView->setModel(mModel);

    auto shortcutEditLayout = new QHBoxLayout;
    mKeyEdit = new QKeySequenceEdit;
    mClearButton = new QPushButton(tr("Clear"));
    mDefaultButton = new QPushButton(tr("Default"));
    shortcutEditLayout->addWidget(new QLabel(tr("Keys:")));
    shortcutEditLayout->addWidget(mKeyEdit, 1);
    shortcutEditLayout->addWidget(mClearButton);
    shortcutEditLayout->addWidget(mDefaultButton);

    shortcutLayout->addWidget(shortcutView, 1);
    shortcutLayout->addLayout(shortcutEditLayout);
    shortcutGroup->setLayout(shortcutLayout);

    layout->addLayout(keyboardLayoutLayout);
    layout->addWidget(mCustomGroup);
    layout->addWidget(shortcutGroup);
    layout->addStretch(1);
    setLayout(layout);

    // I'd like to have both columns 50/50 and user resizeable but
    // couldn't get it working so just do this for now
    shortcutView->resizeColumnToContents(0);

    for (int kblayout = PianoInput::LayoutQwerty; kblayout < PianoInput::LayoutCount; ++kblayout) {
        mLayoutCombo->addItem(PianoInput::layoutName((PianoInput::KeyboardLayout)kblayout));
    }
    mLayoutCombo->setCurrentIndex(input.layout());

    mCustomGroup->setEnabled(input.layout() == PianoInput::LayoutCustom);
    mBindingEdit->setBindings(input.bindings());

    lazyconnect(mBindingEdit, bindingsChanged, this, setDirty<Config::CategoryKeyboard>);

    lazyconnect(mClearButton, clicked, mKeyEdit, clear);
    connect(mDefaultButton, &QPushButton::clicked, this,
        [this]() {
            // sets the default shortcut for the current selection
            mKeyEdit->setKeySequence(ShortcutTable::getDefault((ShortcutTable::Shortcut)mSelectedShortcut));
        });

    connect(shortcutView->selectionModel(), &QItemSelectionModel::selectionChanged, this,
        [this](QItemSelection const& selected) {
            QSignalBlocker blocker(mKeyEdit); // ignore changed signals for the key edit

            bool hasSelection = !selected.isEmpty();
            setKeyEditEnable(hasSelection);
            if (hasSelection) {
                // get the row of the selection
                mSelectedShortcut = selected.indexes().first().row();
                // update the key edit with this row's key sequence
                mKeyEdit->setKeySequence(mShortcuts.get((ShortcutTable::Shortcut)mSelectedShortcut));
            } else {
                // no selection, clear the edit
                mSelectedShortcut = -1;
                mKeyEdit->clear();
            }
        });

    connect(mKeyEdit, &QKeySequenceEdit::keySequenceChanged, this,
        [this](QKeySequence const& seq) {
            // update the shortcut's sequence in the model
            mModel->setShortcut(mSelectedShortcut, seq);
        });

    // any change made to the model dirties the config
    lazyconnect(mModel, dataChanged, this, setDirty<Config::CategoryKeyboard>);

    connect(mLayoutCombo, qOverload<int>(&QComboBox::currentIndexChanged), this,
        [this](int index) {
            if (index != -1) {
                setDirty<Config::CategoryKeyboard>();
                auto const layout = (PianoInput::KeyboardLayout)index;
                mInput.setLayout(layout);
                mBindingEdit->setBindings(mInput.bindings());
                mCustomGroup->setEnabled(layout == PianoInput::LayoutCustom);
            }
        });

    setKeyEditEnable(false);
}